

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O2

void __thiscall
tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject
          (tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> QVar3;
  char cVar4;
  bool bVar5;
  PromiseData<int> *this_00;
  QThread *p_00;
  QObject *pQVar6;
  QEvent *this_01;
  PromiseData<QList<int>_> *this_02;
  long lVar7;
  char *reject;
  initializer_list<QtPromise::QPromise<int>_> args;
  PromiseResolver<int> resolver;
  QPromiseBase<QList<int>_> local_140;
  PromiseResolver<QList<int>_> resolver_1;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  QPromise<int> p2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_f0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_e8;
  _Any_data local_e0;
  undefined **local_d0;
  PromiseData<int> *local_c8;
  undefined **local_c0;
  PromiseData<int> *local_b8;
  QPromise<QList<int>_> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_a0;
  QPromiseBase<QList<int>_> local_98;
  QWeakPointer<QObject> local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  Type p1;
  Type p0;
  
  local_e0._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&p0,(int *)local_e0._M_pod_data);
  local_e0._0_4_ = 0x2c;
  QtPromise::resolve<int>((QtPromise *)&p1,(int *)local_e0._M_pod_data);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128950;
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0._M_unused._M_object = &PTR__QPromiseBase_00128bc8;
  p2.super_QPromiseBase<int>.m_d.d = this_00;
  local_e0._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_e0);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_e0);
  if (resolver.m_d.d == (Data *)0x0) {
    local_78.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_78.d = (Data *)resolver;
  }
  local_58.d = (Data *)0x0;
  if ((Data *)local_78.d == (Data *)0x0) {
    local_128._M_unused._M_object = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_78.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_128._M_unused._0_8_ = local_78.d;
  }
  local_140._vptr_QPromiseBase = (_func_int **)0x0;
  if ((Data *)local_128._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_128._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_128._M_unused._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98._vptr_QPromiseBase = (_func_int **)local_128._M_unused._0_8_;
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_88,p_00);
  if (((local_88.d != (Data *)0x0) &&
      (local_88.value != (QObject *)0x0 &&
       ((local_88.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0)) &&
     (cVar4 = QThread::isFinished(), cVar4 == '\0')) {
    if ((local_88.d == (Data *)0x0) ||
       (((local_88.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
      local_88.value = (QObject *)0x0;
    }
    pQVar6 = (QObject *)QAbstractEventDispatcher::instance((QThread *)local_88.value);
    if ((pQVar6 != (QObject *)0x0) || (cVar4 = QCoreApplication::closingDown(), cVar4 == '\0')) {
      this_01 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_01,None);
      *(undefined ***)this_01 = &PTR__Event_00128770;
      *(void **)(this_01 + 0x10) = local_128._M_unused._M_object;
      if ((Data *)local_128._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_128._M_unused._0_8_ = *local_128._M_unused._M_object + 1;
        UNLOCK();
      }
      QCoreApplication::postEvent(pQVar6,this_01,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_88);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_98
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
             &local_140);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_78
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&local_58
            );
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128bc8;
  local_e0._8_8_ = p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0._M_unused._M_object = &PTR__QPromiseBase_00128bc8;
  local_c8 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d0 = &PTR__QPromiseBase_00128bc8;
  local_b8 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c0 = &PTR__QPromiseBase_00128bc8;
  args._M_len = 3;
  args._M_array = (iterator)&local_e0;
  QList<QtPromise::QPromise<int>_>::QList((QList<QtPromise::QPromise<int>_> *)&local_128,args);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&local_128);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<int>_> *)&local_128);
  lVar7 = 0x20;
  do {
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)((long)&local_e0 + lVar7));
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -0x10);
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_128._M_pod_data[0] = 1;
  local_e0._M_pod_data[0] = bVar5;
  bVar5 = QTest::qCompare<bool,bool>
                    ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x98);
  if (bVar5) {
    local_e0._M_pod_data[0] =
         QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                   (&(p1.super_QPromiseBase<int>.m_d.d)->
                     super_PromiseDataBase<int,_void_(const_int_&)>);
    local_128._M_pod_data[0] = 1;
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,"p1.isFulfilled()"
                       ,"true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x99);
    if (bVar5) {
      local_e0._M_pod_data[0] =
           QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(p2.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
      local_128._M_pod_data[0] = 1;
      bVar5 = QTest::qCompare<bool,bool>
                        ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,"p2.isPending()"
                         ,"true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x9a);
      if (bVar5) {
        local_e0._M_pod_data[0] =
             QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                       (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                         super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        local_128._M_pod_data[0] = 1;
        reject = 
        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
        ;
        bVar5 = QTest::qCompare<bool,bool>
                          ((bool *)local_e0._M_pod_data,(bool *)local_128._M_pod_data,
                           "p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x9b);
        if (bVar5) {
          local_58.size = 0;
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          local_78.size = 0;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001288f0;
          this_02 = (PromiseData<QList<int>_> *)operator_new(0x68);
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
          _M_exception_object = (void *)0x0;
          (this_02->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>
                *)0x0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size
               = 0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size
               = 0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
               (Data *)0x0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
               (Data *)0x0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
               (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
          *(undefined8 *)
           &(this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
          *(undefined8 *)
           &(this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = 0;
          (this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
          _vptr_PromiseDataBase = (_func_int **)0x0;
          *(undefined8 *)
           &(this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData = 0;
          (this_02->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          QtPromisePrivate::PromiseData<QList<int>_>::PromiseData(this_02);
          LOCK();
          pQVar1 = &(this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                    super_QSharedData;
          (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (this_02 != (PromiseData<QList<int>_> *)0x0) {
            LOCK();
            pQVar1 = &(this_02->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
                      super_QSharedData;
            (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i =
                 (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_98._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128a58;
          local_140.m_d.d = this_02;
          local_98.m_d.d = this_02;
          QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
                    (&resolver_1,(QPromise<QList<int>_> *)&local_98);
          QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_98);
          QVar2 = p.super_QPromiseBase<QList<int>_>.m_d;
          if (resolver_1.m_d.d == (Data *)0x0) {
            resolver_1.m_d.d =
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>
                 )(Data *)0x0;
          }
          else {
            LOCK();
            *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
            UNLOCK();
          }
          local_f0.d = (Data *)0x0;
          if (resolver_1.m_d.d == (Data *)0x0) {
            local_a0.d = (Data *)0x0;
          }
          else {
            LOCK();
            (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
            local_a0 = resolver_1.m_d.d;
          }
          local_f8.d = (Data *)0x0;
          local_e8 = resolver_1.m_d.d;
          QtPromisePrivate::PromiseHandler<QList<int>,decltype(nullptr),void>::
          create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
                    ((function<void_(const_QList<int>_&)> *)&local_e0,
                     (PromiseHandler<QList<int>,decltype(nullptr),void> *)0x0,&local_e8,
                     (QPromiseResolve<QList<int>_> *)&local_a0,(QPromiseReject<QList<int>_> *)reject
                    );
          QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
                    (&(QVar2.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
                     (function<void_(const_QList<int>_&)> *)&local_e0);
          std::_Function_base::~_Function_base((_Function_base *)&local_e0);
          QVar3.d = local_a0.d;
          QVar2 = p.super_QPromiseBase<QList<int>_>.m_d;
          resolver.m_d.d =
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
               (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
               local_e8.d;
          if (local_e8.d != (Data *)0x0) {
            LOCK();
            ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          if (local_a0.d != (Data *)0x0) {
            LOCK();
            ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((local_a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_128._M_unused._M_object = (void *)0x0;
          local_128._8_8_ = 0;
          local_118 = (code *)0x0;
          pcStack_110 = (code *)0x0;
          local_128._M_unused._M_object = operator_new(0x18);
          *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
           local_128._M_unused._0_8_ = resolver.m_d.d;
          if (resolver.m_d.d != (Data *)0x0) {
            LOCK();
            *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
            UNLOCK();
          }
          *(Data **)((long)local_128._M_unused._0_8_ + 8) = QVar3.d;
          if (QVar3.d != (Data *)0x0) {
            LOCK();
            ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          *(QArrayDataPointer<char16_t> **)((long)local_128._M_unused._0_8_ + 0x10) = &local_78;
          pcStack_110 = std::
                        _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                        ::_M_invoke;
          local_118 = std::
                      _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                      ::_M_manager;
          QtPromisePrivate::
          PromiseCatcher<QList<int>,waitForError<QList<int>,QString>(QtPromise::QPromise<QList<int>>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1},QString_const&>
          ::
          create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(waitForError<QList<int>,QString>(QtPromise::QPromise<QList<int>>const&,QString_const&)::{lambda(QtPromisePrivate::PromiseError_const&)#1}(QString_const&)#1}const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
          ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
                    ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&resolver);
          QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
                    (&(QVar2.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
                     (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128);
          std::_Function_base::~_Function_base((_Function_base *)&local_128);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
          ~QExplicitlySharedDataPointer(&local_a0);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
          ~QExplicitlySharedDataPointer(&local_f8);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
          ~QExplicitlySharedDataPointer(&local_e8);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
          ~QExplicitlySharedDataPointer(&local_f0);
          QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
          ~QExplicitlySharedDataPointer(&resolver_1.m_d);
          local_140._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00128a58;
          bVar5 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::
                  isPending(&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                             super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
          if (!bVar5) {
            QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
                      (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
          }
          QtPromise::QPromiseBase<QList<int>_>::wait
                    ((QPromiseBase<QList<int>_> *)&resolver,&local_140);
          QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase
                    ((QPromiseBase<QList<int>_> *)&resolver);
          QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_140);
          QString::QString((QString *)&resolver,"foo");
          bVar5 = QTest::qCompare((QString *)&local_78,(QString *)&resolver,
                                  "waitForError(p, QString{})","QString{\"foo\"}",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                  ,0x9c);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&resolver);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          if (bVar5) {
            bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isRejected
                              (&(p2.super_QPromiseBase<int>.m_d.d)->
                                super_PromiseDataBase<int,_void_(const_int_&)>);
            resolver.m_d.d._0_1_ = bVar5;
            local_78.d = (Data *)CONCAT71(local_78.d._1_7_,1);
            QTest::qCompare<bool,bool>
                      ((bool *)&resolver,(bool *)&local_78,"p2.isRejected()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x9d);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p2.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject()
{
    auto p0 = QtPromise::resolve(42);
    auto p1 = QtPromise::resolve(44);
    auto p2 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}